

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O2

void __thiscall
CcsTest_TemplatedBool_Test::~CcsTest_TemplatedBool_Test(CcsTest_TemplatedBool_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CcsTest, TemplatedBool) {
  CcsDomain ccs;
  std::istringstream input(
      "a = true; b = 'true'; c = false; d = 'false'; e = '1'");
  ccs.loadCcsStream(input, "<literal>", ImportResolver::None);
  CcsContext ctx = ccs.build();
  EXPECT_TRUE(ctx.get<bool>("a"));
  EXPECT_TRUE(ctx.get<bool>("b"));
  EXPECT_FALSE(ctx.get<bool>("c"));
  EXPECT_FALSE(ctx.get<bool>("d"));
  EXPECT_ANY_THROW(ctx.get<bool>("e"));
  EXPECT_TRUE(ctx.get("unset", true));
  EXPECT_FALSE(ctx.get("unset", false));
}